

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_sanity_check.cpp
# Opt level: O0

string * __thiscall
(anonymous_namespace)::format_group_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,char **group,char *sep,
          char *last_sep)

{
  char *pcVar1;
  bool bVar2;
  _anonymous_namespace_ *local_38;
  char **sptr;
  int count;
  char *last_sep_local;
  char *sep_local;
  char **group_local;
  string *ret;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  sptr._0_4_ = 0;
  local_38 = this;
  while( true ) {
    bVar2 = false;
    if (local_38 != (_anonymous_namespace_ *)0x0) {
      bVar2 = *(long *)local_38 != 0;
    }
    if (!bVar2) break;
    if ((int)sptr != 0) {
      if (*(long *)(local_38 + 8) == 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
    pcVar1 = (char *)std::__cxx11::string::append((char *)__return_storage_ptr__);
    pcVar1 = (char *)std::__cxx11::string::append(pcVar1);
    std::__cxx11::string::append(pcVar1);
    local_38 = local_38 + 8;
    sptr._0_4_ = (int)sptr + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string format_group(const char* const* group, const char* sep, const char* last_sep)
{
    std::string ret;
    int         count = 0;

    for (const char* const* sptr = group; sptr && *sptr; ++sptr) {
        if (count++) {
            if (*(sptr + 1) == nullptr)
                ret.append(last_sep);
            else
                ret.append(sep);
        }

        ret.append("\"").append(*sptr).append("\"");
    }

    return ret;
}